

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesize.cpp
# Opt level: O2

void __thiscall
QPageSizePrivate::QPageSizePrivate
          (QPageSizePrivate *this,QString *key,QSize *pointSize,QString *name)

{
  char *pcVar1;
  bool bVar2;
  PageSizeId PVar3;
  QSize *extraout_RDX;
  QSize *extraout_RDX_00;
  QSize *match;
  QSize *extraout_RDX_01;
  long lVar4;
  char *data;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  (this->m_key).d.d = (Data *)0x0;
  (this->m_key).d.ptr = (char16_t *)0x0;
  (this->m_key).d.size = 0;
  this->m_id = Custom;
  (this->m_pointSize).wd = -1;
  (this->m_pointSize).ht.m_i = -1;
  (this->m_name).d.d = (Data *)0x0;
  (this->m_name).d.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&(this->m_name).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->m_name).d.size + 4) = 0;
  *(undefined4 *)&(this->m_size).wd = 0;
  *(undefined4 *)((long)&(this->m_size).wd + 4) = 0xbff00000;
  *(undefined4 *)&(this->m_size).ht = 0;
  *(undefined4 *)((long)&(this->m_size).ht + 4) = 0xbff00000;
  this->m_units = Point;
  lVar4 = (key->d).size;
  if (((lVar4 != 0) && (-1 < (pointSize->wd).m_i)) && (-1 < (pointSize->ht).m_i)) {
    local_48.m_data = (key->d).ptr;
    s.m_data = "Rotated";
    s.m_size = 7;
    local_48.m_size = lVar4;
    bVar2 = QStringView::endsWith(&local_48,s,CaseSensitive);
    if (bVar2) {
      local_48.m_size = local_48.m_size + -7;
      match = extraout_RDX;
    }
    else {
      s_00.m_data = ".Transverse";
      s_00.m_size = 0xb;
      bVar2 = QStringView::endsWith(&local_48,s_00,CaseSensitive);
      match = extraout_RDX_00;
      if (bVar2) {
        local_48.m_size = local_48.m_size + -0xb;
      }
    }
    lVar4 = 0x78;
    pcVar1 = qt_pageSizes[0].mediaOption;
    do {
      data = pcVar1;
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) goto LAB_00366fd8;
      local_58.m_size = QtPrivate::lengthHelperPointer<char>(data);
      local_58.m_data = data;
      bVar2 = ::comparesEqual(&local_58,&local_48);
      match = extraout_RDX_01;
      pcVar1 = data + 0x40;
    } while (!bVar2);
    PVar3 = (PageSizeId)*(byte *)(data + -0x28);
    if (*(byte *)(data + -0x28) == 0x1f) {
LAB_00366fd8:
      PVar3 = qt_idForPointSize(pointSize,FuzzyMatch,match);
    }
    if (PVar3 == Custom) {
      init(this,(EVP_PKEY_CTX *)pointSize);
    }
    else {
      init(this,(EVP_PKEY_CTX *)(ulong)PVar3);
    }
    QString::operator=(&this->m_key,(QString *)key);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QPageSizePrivate::QPageSizePrivate(const QString &key, const QSize &pointSize, const QString &name)
    : m_id(QPageSize::Custom),
      m_windowsId(0),
      m_units(QPageSize::Point)
{
    if (!key.isEmpty() && pointSize.isValid()) {
        QPageSize::PageSizeId id = qt_idForPpdKey(key, nullptr);
        // If not a known PPD key, check if size is a standard PPD size
        if (id == QPageSize::Custom)
            id = qt_idForPointSize(pointSize, QPageSize::FuzzyMatch, nullptr);
        id == QPageSize::Custom ? init(pointSize, name) : init(id, name);
        m_key = key;
    }
}